

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O3

void __thiscall Sequence<DNA>::Sequence(Sequence<DNA> *this,Sequence<DNA> *sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->identifier).field_2;
  (this->identifier)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (sequence->identifier)._M_dataplus._M_p;
  paVar2 = &(sequence->identifier).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(sequence->identifier).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->identifier).field_2 + 8) = uVar4;
  }
  else {
    (this->identifier)._M_dataplus._M_p = pcVar3;
    (this->identifier).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->identifier)._M_string_length = (sequence->identifier)._M_string_length;
  (sequence->identifier)._M_dataplus._M_p = (pointer)paVar2;
  (sequence->identifier)._M_string_length = 0;
  (sequence->identifier).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->quality).field_2;
  (this->quality)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (sequence->quality)._M_dataplus._M_p;
  paVar2 = &(sequence->quality).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(sequence->quality).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->quality).field_2 + 8) = uVar4;
  }
  else {
    (this->quality)._M_dataplus._M_p = pcVar3;
    (this->quality).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->quality)._M_string_length = (sequence->quality)._M_string_length;
  (sequence->quality)._M_dataplus._M_p = (pointer)paVar2;
  (sequence->quality)._M_string_length = 0;
  (sequence->quality).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->sequence).field_2;
  (this->sequence)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (sequence->sequence)._M_dataplus._M_p;
  paVar2 = &(sequence->sequence).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(sequence->sequence).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->sequence).field_2 + 8) = uVar4;
  }
  else {
    (this->sequence)._M_dataplus._M_p = pcVar3;
    (this->sequence).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->sequence)._M_string_length = (sequence->sequence)._M_string_length;
  (sequence->sequence)._M_dataplus._M_p = (pointer)paVar2;
  (sequence->sequence)._M_string_length = 0;
  (sequence->sequence).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Sequence< A >::Sequence( Sequence< A >&& sequence )
    : sequence( std::move( sequence.sequence ) ),
      identifier( std::move( sequence.identifier ) ),
      quality( std::move( sequence.quality ) ) {}